

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx512::SphereMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Geometry *pGVar3;
  long lVar4;
  __int_type_conflict _Var5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined8 uVar14;
  byte bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  ushort uVar28;
  ulong uVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar61 [64];
  undefined1 auVar63 [64];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<8> hit;
  int local_280;
  ushort local_27c;
  ushort local_27a;
  Scene *local_278;
  Primitive *local_270;
  float local_264;
  undefined4 local_260;
  uint local_25c;
  undefined4 local_258;
  undefined8 local_254;
  undefined4 local_24c;
  uint local_248;
  uint local_244;
  uint local_240;
  RTCFilterFunctionNArguments local_230;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [2] [32];
  float fVar30;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar55 [64];
  undefined1 auVar60 [32];
  undefined1 auVar62 [32];
  
  local_278 = context->scene;
  pGVar3 = (local_278->geometries).items[sphere->sharedGeomID].ptr;
  lVar4 = *(long *)&pGVar3->field_0x58;
  _Var5 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[4] * _Var5);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[0] * _Var5);
  auVar32._16_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[5] * _Var5);
  auVar32._0_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[1] * _Var5);
  auVar33._16_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[6] * _Var5);
  auVar33._0_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[2] * _Var5);
  auVar34._16_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[7] * _Var5);
  auVar34._0_16_ = *(undefined1 (*) [16])(lVar4 + (sphere->primIDs).field_0.i[3] * _Var5);
  auVar35 = vunpcklps_avx(auVar44,auVar33);
  auVar11 = vunpckhps_avx(auVar44,auVar33);
  auVar44 = vunpcklps_avx(auVar32,auVar34);
  auVar12 = vunpckhps_avx(auVar32,auVar34);
  auVar37 = vunpcklps_avx(auVar35,auVar44);
  auVar35 = vunpckhps_avx(auVar35,auVar44);
  auVar36 = vunpcklps_avx(auVar11,auVar12);
  auVar44 = vunpckhps_avx(auVar11,auVar12);
  local_80[0] = vpbroadcastd_avx512vl();
  aVar2 = (ray->dir).field_0;
  auVar32 = vpbroadcastd_avx512vl();
  auVar68 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar31._12_4_ = 0;
  auVar31._0_12_ = ZEXT812(0);
  auVar31 = vrcp14ss_avx512f(auVar31 << 0x20,ZEXT416(auVar68._0_4_));
  auVar68 = vfnmadd213ss_fma(auVar68,auVar31,ZEXT416(0x40000000));
  fVar67 = auVar31._0_4_ * auVar68._0_4_;
  fVar65 = (ray->dir).field_0.m128[0];
  auVar60._4_4_ = fVar65;
  auVar60._0_4_ = fVar65;
  auVar60._8_4_ = fVar65;
  auVar60._12_4_ = fVar65;
  auVar60._16_4_ = fVar65;
  auVar60._20_4_ = fVar65;
  auVar60._24_4_ = fVar65;
  auVar60._28_4_ = fVar65;
  auVar61 = ZEXT3264(auVar60);
  fVar66 = (ray->dir).field_0.m128[1];
  auVar62._4_4_ = fVar66;
  auVar62._0_4_ = fVar66;
  auVar62._8_4_ = fVar66;
  auVar62._12_4_ = fVar66;
  auVar62._16_4_ = fVar66;
  auVar62._20_4_ = fVar66;
  auVar62._24_4_ = fVar66;
  auVar62._28_4_ = fVar66;
  auVar63 = ZEXT3264(auVar62);
  fVar64 = (ray->dir).field_0.m128[2];
  uVar1 = *(undefined4 *)&(ray->org).field_0;
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  auVar33 = vsubps_avx512vl(auVar37,auVar11);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  auVar12._16_4_ = uVar1;
  auVar12._20_4_ = uVar1;
  auVar12._24_4_ = uVar1;
  auVar12._28_4_ = uVar1;
  auVar34 = vsubps_avx512vl(auVar35,auVar12);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar35 = vsubps_avx512vl(auVar36,auVar35);
  auVar47._0_4_ = fVar64 * auVar35._0_4_;
  auVar47._4_4_ = fVar64 * auVar35._4_4_;
  auVar47._8_4_ = fVar64 * auVar35._8_4_;
  auVar47._12_4_ = fVar64 * auVar35._12_4_;
  auVar47._16_4_ = fVar64 * auVar35._16_4_;
  auVar47._20_4_ = fVar64 * auVar35._20_4_;
  auVar47._24_4_ = fVar64 * auVar35._24_4_;
  auVar47._28_4_ = 0;
  auVar68 = vfmadd231ps_fma(auVar47,auVar34,auVar62);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar33,auVar60);
  auVar48._0_4_ = fVar67 * auVar68._0_4_;
  auVar48._4_4_ = fVar67 * auVar68._4_4_;
  auVar48._8_4_ = fVar67 * auVar68._8_4_;
  auVar48._12_4_ = fVar67 * auVar68._12_4_;
  auVar48._16_4_ = fVar67 * 0.0;
  auVar48._20_4_ = fVar67 * 0.0;
  auVar48._24_4_ = fVar67 * 0.0;
  auVar48._28_4_ = 0;
  auVar57._0_4_ = fVar65 * auVar48._0_4_;
  auVar57._4_4_ = fVar65 * auVar48._4_4_;
  auVar57._8_4_ = fVar65 * auVar48._8_4_;
  auVar57._12_4_ = fVar65 * auVar48._12_4_;
  auVar57._16_4_ = fVar65 * auVar48._16_4_;
  auVar57._20_4_ = fVar65 * auVar48._20_4_;
  auVar57._24_4_ = fVar65 * auVar48._24_4_;
  auVar57._28_4_ = 0;
  auVar53._0_4_ = fVar66 * auVar48._0_4_;
  auVar53._4_4_ = fVar66 * auVar48._4_4_;
  auVar53._8_4_ = fVar66 * auVar48._8_4_;
  auVar53._12_4_ = fVar66 * auVar48._12_4_;
  auVar53._16_4_ = fVar66 * auVar48._16_4_;
  auVar53._20_4_ = fVar66 * auVar48._20_4_;
  auVar53._28_36_ = in_ZMM8._28_36_;
  auVar53._24_4_ = fVar66 * auVar48._24_4_;
  auVar55._0_4_ = fVar64 * auVar48._0_4_;
  auVar55._4_4_ = fVar64 * auVar48._4_4_;
  auVar55._8_4_ = fVar64 * auVar48._8_4_;
  auVar55._12_4_ = fVar64 * auVar48._12_4_;
  auVar55._16_4_ = fVar64 * auVar48._16_4_;
  auVar55._20_4_ = fVar64 * auVar48._20_4_;
  auVar55._28_36_ = in_ZMM9._28_36_;
  auVar55._24_4_ = fVar64 * auVar48._24_4_;
  auVar11 = vsubps_avx(auVar33,auVar57);
  auVar58 = ZEXT3264(auVar11);
  auVar12 = vsubps_avx(auVar34,auVar53._0_32_);
  auVar59 = ZEXT3264(auVar12);
  auVar35 = vsubps_avx(auVar35,auVar55._0_32_);
  auVar53 = ZEXT3264(auVar35);
  auVar37._4_4_ = auVar35._4_4_ * auVar35._4_4_;
  auVar37._0_4_ = auVar35._0_4_ * auVar35._0_4_;
  auVar37._8_4_ = auVar35._8_4_ * auVar35._8_4_;
  auVar37._12_4_ = auVar35._12_4_ * auVar35._12_4_;
  auVar37._16_4_ = auVar35._16_4_ * auVar35._16_4_;
  auVar37._20_4_ = auVar35._20_4_ * auVar35._20_4_;
  auVar37._24_4_ = auVar35._24_4_ * auVar35._24_4_;
  auVar37._28_4_ = auVar34._28_4_;
  auVar68 = vfmadd231ps_fma(auVar37,auVar12,auVar12);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar11,auVar11);
  auVar36._4_4_ = auVar44._4_4_ * auVar44._4_4_;
  auVar36._0_4_ = auVar44._0_4_ * auVar44._0_4_;
  auVar36._8_4_ = auVar44._8_4_ * auVar44._8_4_;
  auVar36._12_4_ = auVar44._12_4_ * auVar44._12_4_;
  auVar36._16_4_ = auVar44._16_4_ * auVar44._16_4_;
  auVar36._20_4_ = auVar44._20_4_ * auVar44._20_4_;
  auVar36._24_4_ = auVar44._24_4_ * auVar44._24_4_;
  auVar36._28_4_ = auVar33._28_4_;
  uVar13 = vcmpps_avx512vl(ZEXT1632(auVar68),auVar36,2);
  uVar14 = vpcmpgtd_avx512vl(auVar32,_DAT_0205a920);
  bVar25 = (byte)uVar13 & (byte)uVar14;
  if (bVar25 != 0) {
    auVar44 = vsubps_avx(auVar36,ZEXT1632(auVar68));
    auVar18._4_4_ = fVar67 * auVar44._4_4_;
    auVar18._0_4_ = fVar67 * auVar44._0_4_;
    auVar18._8_4_ = fVar67 * auVar44._8_4_;
    auVar18._12_4_ = fVar67 * auVar44._12_4_;
    auVar18._16_4_ = fVar67 * auVar44._16_4_;
    auVar18._20_4_ = fVar67 * auVar44._20_4_;
    auVar18._24_4_ = fVar67 * auVar44._24_4_;
    auVar18._28_4_ = fVar67;
    auVar44 = vsqrtps_avx(auVar18);
    auVar56 = ZEXT3264(auVar44);
    auVar37 = vsubps_avx(auVar48,auVar44);
    auVar54._0_4_ = auVar48._0_4_ + auVar44._0_4_;
    auVar54._4_4_ = auVar48._4_4_ + auVar44._4_4_;
    auVar54._8_4_ = auVar48._8_4_ + auVar44._8_4_;
    auVar54._12_4_ = auVar48._12_4_ + auVar44._12_4_;
    auVar54._16_4_ = auVar48._16_4_ + auVar44._16_4_;
    auVar54._20_4_ = auVar48._20_4_ + auVar44._20_4_;
    auVar54._24_4_ = auVar48._24_4_ + auVar44._24_4_;
    auVar54._28_4_ = auVar44._28_4_ + 0.0;
    auVar55 = ZEXT3264(auVar54);
    uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
    auVar49._4_4_ = uVar1;
    auVar49._0_4_ = uVar1;
    auVar49._8_4_ = uVar1;
    auVar49._12_4_ = uVar1;
    auVar49._16_4_ = uVar1;
    auVar49._20_4_ = uVar1;
    auVar49._24_4_ = uVar1;
    auVar49._28_4_ = uVar1;
    fVar67 = ray->tfar;
    auVar51._4_4_ = fVar67;
    auVar51._0_4_ = fVar67;
    auVar51._8_4_ = fVar67;
    auVar51._12_4_ = fVar67;
    auVar51._16_4_ = fVar67;
    auVar51._20_4_ = fVar67;
    auVar51._24_4_ = fVar67;
    auVar51._28_4_ = fVar67;
    uVar29 = vcmpps_avx512vl(auVar37,auVar51,2);
    uVar24 = vcmpps_avx512vl(auVar49,auVar37,2);
    uVar29 = uVar29 & uVar24;
    bVar26 = (byte)uVar29 & bVar25;
    uVar13 = vcmpps_avx512vl(auVar49,auVar54,2);
    uVar14 = vcmpps_avx512vl(auVar54,auVar51,2);
    bVar27 = (byte)uVar13 & (byte)uVar14;
    bVar15 = bVar27 & bVar25;
    uVar28 = (ushort)bVar15;
    if (bVar26 != 0 || bVar15 != 0) {
      auVar36 = vblendmps_avx512vl(auVar54,auVar37);
      local_1c0._0_4_ =
           (uint)(bVar26 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar37._0_4_;
      bVar7 = (bool)(bVar26 >> 1 & 1);
      local_1c0._4_4_ = (uint)bVar7 * auVar36._4_4_ | (uint)!bVar7 * auVar37._4_4_;
      bVar7 = (bool)(bVar26 >> 2 & 1);
      local_1c0._8_4_ = (uint)bVar7 * auVar36._8_4_ | (uint)!bVar7 * auVar37._8_4_;
      bVar7 = (bool)(bVar26 >> 3 & 1);
      local_1c0._12_4_ = (uint)bVar7 * auVar36._12_4_ | (uint)!bVar7 * auVar37._12_4_;
      bVar7 = (bool)(bVar26 >> 4 & 1);
      local_1c0._16_4_ = (uint)bVar7 * auVar36._16_4_ | (uint)!bVar7 * auVar37._16_4_;
      bVar7 = (bool)(bVar26 >> 5 & 1);
      local_1c0._20_4_ = (uint)bVar7 * auVar36._20_4_ | (uint)!bVar7 * auVar37._20_4_;
      bVar7 = (bool)(bVar26 >> 6 & 1);
      local_1c0._24_4_ = (uint)bVar7 * auVar36._24_4_ | (uint)!bVar7 * auVar37._24_4_;
      local_1c0._28_4_ =
           (uint)(bVar26 >> 7) * auVar36._28_4_ | (uint)!(bool)(bVar26 >> 7) * auVar37._28_4_;
      auVar45 = ZEXT3264(local_1c0);
      auVar16._8_4_ = 0x80000000;
      auVar16._0_8_ = 0x8000000080000000;
      auVar16._12_4_ = 0x80000000;
      auVar16._16_4_ = 0x80000000;
      auVar16._20_4_ = 0x80000000;
      auVar16._24_4_ = 0x80000000;
      auVar16._28_4_ = 0x80000000;
      auVar37 = vxorps_avx512vl(auVar44,auVar16);
      fVar30 = (float)((uint)(bVar26 & 1) * auVar37._0_4_ |
                      (uint)!(bool)(bVar26 & 1) * (int)auVar44._0_4_);
      bVar7 = (bool)(bVar26 >> 1 & 1);
      fVar38 = (float)((uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * (int)auVar44._4_4_);
      bVar7 = (bool)(bVar26 >> 2 & 1);
      fVar39 = (float)((uint)bVar7 * auVar37._8_4_ | (uint)!bVar7 * (int)auVar44._8_4_);
      bVar7 = (bool)(bVar26 >> 3 & 1);
      fVar40 = (float)((uint)bVar7 * auVar37._12_4_ | (uint)!bVar7 * (int)auVar44._12_4_);
      bVar7 = (bool)(bVar26 >> 4 & 1);
      fVar41 = (float)((uint)bVar7 * auVar37._16_4_ | (uint)!bVar7 * (int)auVar44._16_4_);
      bVar7 = (bool)(bVar26 >> 5 & 1);
      fVar42 = (float)((uint)bVar7 * auVar37._20_4_ | (uint)!bVar7 * (int)auVar44._20_4_);
      bVar7 = (bool)(bVar26 >> 6 & 1);
      fVar43 = (float)((uint)bVar7 * auVar37._24_4_ | (uint)!bVar7 * (int)auVar44._24_4_);
      auVar19._4_4_ = fVar65 * fVar38;
      auVar19._0_4_ = fVar65 * fVar30;
      auVar19._8_4_ = fVar65 * fVar39;
      auVar19._12_4_ = fVar65 * fVar40;
      auVar19._16_4_ = fVar65 * fVar41;
      auVar19._20_4_ = fVar65 * fVar42;
      auVar19._24_4_ = fVar65 * fVar43;
      auVar19._28_4_ = fVar67;
      auVar20._4_4_ = fVar66 * fVar38;
      auVar20._0_4_ = fVar66 * fVar30;
      auVar20._8_4_ = fVar66 * fVar39;
      auVar20._12_4_ = fVar66 * fVar40;
      auVar20._16_4_ = fVar66 * fVar41;
      auVar20._20_4_ = fVar66 * fVar42;
      auVar20._24_4_ = fVar66 * fVar43;
      auVar20._28_4_ = auVar33._28_4_;
      auVar21._4_4_ = fVar64 * fVar38;
      auVar21._0_4_ = fVar64 * fVar30;
      auVar21._8_4_ = fVar64 * fVar39;
      auVar21._12_4_ = fVar64 * fVar40;
      auVar21._16_4_ = fVar64 * fVar41;
      auVar21._20_4_ = fVar64 * fVar42;
      auVar21._24_4_ = fVar64 * fVar43;
      auVar21._28_4_ =
           (uint)(bVar26 >> 7) * auVar37._28_4_ | (uint)!(bool)(bVar26 >> 7) * (int)auVar44._28_4_;
      local_1a0 = vsubps_avx(auVar19,auVar11);
      auVar52 = ZEXT3264(local_1a0);
      local_180 = vsubps_avx(auVar20,auVar12);
      local_160 = vsubps_avx(auVar21,auVar35);
      auVar50 = ZEXT3264(local_160);
      uVar24 = (ulong)(bVar25 & ((byte)uVar29 | bVar27));
      fVar65 = fVar64;
      fVar66 = fVar64;
      fVar67 = fVar64;
      fVar30 = fVar64;
      fVar38 = fVar64;
      fVar39 = fVar64;
      fVar40 = fVar64;
      do {
        local_230.hit = (RTCHitN *)&local_260;
        uVar22 = 0;
        for (uVar23 = uVar24; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          uVar22 = uVar22 + 1;
        }
        local_248 = *(uint *)(local_80[0] + uVar22 * 4);
        pGVar3 = (local_278->geometries).items[local_248].ptr;
        local_230.ray = (RTCRayN *)ray;
        if ((pGVar3->mask & ray->mask) == 0) {
LAB_01cdc8de:
          uVar24 = uVar24 ^ 1L << (uVar22 & 0x3f);
          bVar25 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar23 = (ulong)(uint)((int)uVar22 * 4);
            local_24c = *(undefined4 *)((long)&(sphere->primIDs).field_0 + uVar23);
            auVar45 = ZEXT464((uint)*(float *)(local_1c0 + uVar23));
            local_260 = *(undefined4 *)(local_1a0 + uVar23);
            local_25c = *(uint *)(local_180 + uVar23);
            auVar52 = ZEXT464(local_25c);
            local_258 = *(undefined4 *)(local_160 + uVar23);
            local_254 = 0;
            local_244 = context->user->instID[0];
            local_240 = context->user->instPrimID[0];
            local_264 = ray->tfar;
            auVar50 = ZEXT464((uint)local_264);
            ray->tfar = *(float *)(local_1c0 + uVar23);
            local_280 = -1;
            local_230.geometryUserPtr = pGVar3->userPtr;
            local_230.context = context->user;
            local_230.N = 1;
            local_1e0 = auVar61._0_32_;
            local_200 = auVar63._0_32_;
            local_a0 = fVar64;
            fStack_9c = fVar65;
            fStack_98 = fVar66;
            fStack_94 = fVar67;
            fStack_90 = fVar30;
            fStack_8c = fVar38;
            fStack_88 = fVar39;
            fStack_84 = fVar40;
            local_c0 = auVar53._0_32_;
            local_e0 = auVar58._0_32_;
            local_100 = auVar59._0_32_;
            local_120 = auVar55._0_32_;
            local_140 = auVar56._0_32_;
            local_27a = (ushort)uVar29;
            local_27c = uVar28;
            local_230.valid = &local_280;
            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar52 = ZEXT464(local_25c);
              local_270 = sphere;
              local_230.valid = &local_280;
              auVar68 = (*pGVar3->occlusionFilterN)(&local_230);
              auVar50._0_8_ = auVar68._8_8_;
              auVar45._0_8_ = auVar68._0_8_;
              auVar50._8_56_ = extraout_var_01;
              auVar45._8_56_ = extraout_var;
              uVar29 = (ulong)local_27a;
              auVar56 = ZEXT3264(local_140);
              auVar55 = ZEXT3264(local_120);
              auVar59 = ZEXT3264(local_100);
              auVar58 = ZEXT3264(local_e0);
              auVar53 = ZEXT3264(local_c0);
              auVar63 = ZEXT3264(local_200);
              auVar61 = ZEXT3264(local_1e0);
              sphere = local_270;
              if (*local_230.valid != 0) goto LAB_01cdca8c;
LAB_01cdcb2e:
              auVar45 = ZEXT464((uint)local_264);
              ray->tfar = local_264;
              uVar28 = local_27c;
              fVar64 = local_a0;
              fVar65 = fStack_9c;
              fVar66 = fStack_98;
              fVar67 = fStack_94;
              fVar30 = fStack_90;
              fVar38 = fStack_8c;
              fVar39 = fStack_88;
              fVar40 = fStack_84;
              goto LAB_01cdc8de;
            }
LAB_01cdca8c:
            p_Var6 = context->args->filter;
            uVar28 = local_27c;
            fVar64 = local_a0;
            fVar65 = fStack_9c;
            fVar66 = fStack_98;
            fVar67 = fStack_94;
            fVar30 = fStack_90;
            fVar38 = fStack_8c;
            fVar39 = fStack_88;
            fVar40 = fStack_84;
            if (p_Var6 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                auVar52 = ZEXT1664(auVar52._0_16_);
                auVar68 = (*p_Var6)(&local_230);
                auVar50._0_8_ = auVar68._8_8_;
                auVar45._0_8_ = auVar68._0_8_;
                auVar50._8_56_ = extraout_var_02;
                auVar45._8_56_ = extraout_var_00;
                uVar29 = (ulong)local_27a;
                auVar56 = ZEXT3264(local_140);
                auVar55 = ZEXT3264(local_120);
                auVar59 = ZEXT3264(local_100);
                auVar58 = ZEXT3264(local_e0);
                auVar53 = ZEXT3264(local_c0);
                auVar63 = ZEXT3264(local_200);
                auVar61 = ZEXT3264(local_1e0);
              }
              uVar28 = local_27c;
              fVar64 = local_a0;
              fVar65 = fStack_9c;
              fVar66 = fStack_98;
              fVar67 = fStack_94;
              fVar30 = fStack_90;
              fVar38 = fStack_8c;
              fVar39 = fStack_88;
              fVar40 = fStack_84;
              if (*local_230.valid == 0) goto LAB_01cdcb2e;
            }
          }
          bVar25 = 0;
        }
      } while ((bool)(uVar24 != 0 & bVar25));
      fVar40 = ray->tfar;
      auVar17._4_4_ = fVar40;
      auVar17._0_4_ = fVar40;
      auVar17._8_4_ = fVar40;
      auVar17._12_4_ = fVar40;
      auVar17._16_4_ = fVar40;
      auVar17._20_4_ = fVar40;
      auVar17._24_4_ = fVar40;
      auVar17._28_4_ = fVar40;
      uVar13 = vcmpps_avx512vl(auVar55._0_32_,auVar17,2);
      bVar26 = (byte)uVar29 & (byte)uVar13;
      if ((bVar26 & (byte)uVar28) == 0) {
        return (bool)(bVar25 ^ 1);
      }
      fVar40 = auVar56._0_4_;
      auVar46._0_4_ = auVar61._0_4_ * fVar40;
      fVar41 = auVar56._4_4_;
      auVar46._4_4_ = auVar61._4_4_ * fVar41;
      fVar42 = auVar56._8_4_;
      auVar46._8_4_ = auVar61._8_4_ * fVar42;
      fVar43 = auVar56._12_4_;
      auVar46._12_4_ = auVar61._12_4_ * fVar43;
      fVar8 = auVar56._16_4_;
      auVar46._16_4_ = auVar61._16_4_ * fVar8;
      fVar9 = auVar56._20_4_;
      auVar46._20_4_ = auVar61._20_4_ * fVar9;
      fVar10 = auVar56._24_4_;
      auVar46._28_36_ = auVar45._28_36_;
      auVar46._24_4_ = auVar61._24_4_ * fVar10;
      auVar61._0_4_ = auVar63._0_4_ * fVar40;
      auVar61._4_4_ = auVar63._4_4_ * fVar41;
      auVar61._8_4_ = auVar63._8_4_ * fVar42;
      auVar61._12_4_ = auVar63._12_4_ * fVar43;
      auVar61._16_4_ = auVar63._16_4_ * fVar8;
      auVar61._20_4_ = auVar63._20_4_ * fVar9;
      auVar61._28_36_ = auVar50._28_36_;
      auVar61._24_4_ = auVar63._24_4_ * fVar10;
      auVar63._0_4_ = fVar64 * fVar40;
      auVar63._4_4_ = fVar65 * fVar41;
      auVar63._8_4_ = fVar66 * fVar42;
      auVar63._12_4_ = fVar67 * fVar43;
      auVar63._16_4_ = fVar30 * fVar8;
      auVar63._20_4_ = fVar38 * fVar9;
      auVar63._28_36_ = auVar52._28_36_;
      auVar63._24_4_ = fVar39 * fVar10;
      local_1a0 = vsubps_avx(auVar46._0_32_,auVar58._0_32_);
      local_180 = vsubps_avx(auVar61._0_32_,auVar59._0_32_);
      local_1c0 = auVar55._0_32_;
      local_160 = vsubps_avx(auVar63._0_32_,auVar53._0_32_);
      local_278 = context->scene;
      uVar29 = (ulong)(bVar26 & (byte)uVar28);
      local_270 = sphere;
      do {
        local_230.hit = (RTCHitN *)&local_260;
        uVar24 = 0;
        for (uVar22 = uVar29; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          uVar24 = uVar24 + 1;
        }
        local_248 = *(uint *)(local_80[0] + uVar24 * 4);
        pGVar3 = (local_278->geometries).items[local_248].ptr;
        if ((pGVar3->mask & ray->mask) == 0) {
LAB_01cdcbe0:
          uVar29 = uVar29 ^ 1L << (uVar24 & 0x3f);
          bVar26 = 1;
        }
        else {
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            uVar22 = (ulong)(uint)((int)uVar24 * 4);
            local_24c = *(undefined4 *)((long)&(local_270->primIDs).field_0 + uVar22);
            local_260 = *(undefined4 *)(local_1a0 + uVar22);
            local_25c = *(uint *)(local_180 + uVar22);
            local_258 = *(undefined4 *)(local_160 + uVar22);
            local_254 = 0;
            local_244 = context->user->instID[0];
            local_240 = context->user->instPrimID[0];
            local_1e0._0_4_ = ray->tfar;
            ray->tfar = *(float *)(local_1c0 + uVar22);
            local_280 = -1;
            local_230.geometryUserPtr = pGVar3->userPtr;
            local_230.context = context->user;
            local_230.N = 1;
            local_230.valid = &local_280;
            local_230.ray = (RTCRayN *)ray;
            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              local_200._0_8_ = context;
              local_230.valid = &local_280;
              (*pGVar3->occlusionFilterN)(&local_230);
              context = (RayQueryContext *)local_200._0_8_;
              if (*local_230.valid != 0) goto LAB_01cdcce5;
LAB_01cdcd31:
              ray->tfar = (float)local_1e0._0_4_;
              goto LAB_01cdcbe0;
            }
LAB_01cdcce5:
            p_Var6 = context->args->filter;
            if (p_Var6 != (RTCFilterFunctionN)0x0) {
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar3->field_8).field_0x2 & 0x40) != 0)) {
                (*p_Var6)(&local_230);
              }
              if (*local_230.valid == 0) goto LAB_01cdcd31;
            }
          }
          bVar26 = 0;
        }
        if (!(bool)(uVar29 != 0 & bVar26)) {
          return (bool)(bVar25 ^ 1 | bVar26 ^ 1);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre,
                                         Ray& ray,
                                         RayQueryContext* context,
                                         const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Occluded1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }